

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::BiasLayerParams::ByteSizeLong(BiasLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  long lVar6;
  int index;
  ulong uVar7;
  size_t sVar8;
  
  iVar1 = (this->shape_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->shape_,index);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar6 = lVar6 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar3 = (uint)lVar6;
  if (lVar6 == 0) {
    uVar7 = 0;
  }
  else if ((int)uVar3 < 0) {
    uVar7 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_shape_cached_byte_size_ = uVar3;
  sVar8 = uVar7 + lVar6;
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (BiasLayerParams *)&_BiasLayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->bias_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar8 = sVar8 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t BiasLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiasLayerParams)
  size_t total_size = 0;

  // repeated uint64 shape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams bias = 2;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}